

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_serialization_unit_test.cpp
# Opt level: O0

void __thiscall
simplex_tree_serialization_exception<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
::test_method(simplex_tree_serialization_exception<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
              *this)

{
  undefined8 uVar1;
  bool bVar2;
  char *buffer_00;
  ostream *poVar3;
  void *pvVar4;
  lazy_ostream *prev;
  invalid_argument *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]> local_148;
  assertion_result local_128;
  basic_cstring<const_char> local_110;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0 [2];
  basic_cstring<const_char> local_d0;
  undefined1 local_c0 [8];
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> st;
  ulong local_30;
  size_t idx;
  char *buffer;
  size_t too_long_buffer_size;
  simplex_tree_serialization_exception<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
  *this_local;
  
  buffer_00 = (char *)operator_new__(0x100);
  std::operator<<((ostream *)&std::clog,"Serialization of a too long buffer:\n");
  for (local_30 = 0; local_30 < 0x100; local_30 = local_30 + 1) {
    st._135_1_ = std::setfill<char>('0');
    poVar3 = std::operator<<(&std::clog,st._135_1_);
    st.dimension_ = (int)std::setw(2);
    poVar3 = std::operator<<(poVar3,(_Setw)st.dimension_);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::uppercase);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,(uint)(byte)buffer_00[local_30]);
    poVar3 = std::operator<<(poVar3," ");
    std::ostream::operator<<(poVar3,std::dec);
  }
  std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *)local_c0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
               ,0x84);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d0,0x101,local_f0);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::serialize
              ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *)local_c0,
               buffer_00,0x100);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
                 ,0x84);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_110);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_100,0x101,&local_110);
      boost::test_tools::assertion_result::assertion_result(&local_128,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_148,prev,
                 (char (*) [56])"exception std::invalid_argument expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
                 ,0x84);
      boost::test_tools::tt_detail::report_assertion(&local_128,&local_148,&ex,0x101,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]>::
      ~lazy_ostream_impl(&local_148);
      boost::test_tools::assertion_result::~assertion_result(&local_128);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (buffer_00 != (char *)0x0) {
    operator_delete__(buffer_00);
  }
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *)local_c0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_serialization_exception, Stree, list_of_tested_variants) {
  const std::size_t too_long_buffer_size = 256;
  char* buffer = new char[too_long_buffer_size];

  std::clog << "Serialization of a too long buffer:\n";
  for (std::size_t idx = 0; idx < too_long_buffer_size; idx++) {
    std::clog << std::setfill('0') 
              << std::setw(2) 
              << std::uppercase 
              << std::hex << (0xFF & buffer[idx]) << " " << std::dec;
  }
  std::clog << std::endl;
  Stree st;
  BOOST_CHECK_THROW(st.serialize(buffer, too_long_buffer_size), std::invalid_argument);
  delete[] buffer;
}